

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ItemInputable(ImGuiWindow *window,ImGuiID id)

{
  ImGuiContext_conflict *pIVar1;
  bool bVar2;
  int local_2c;
  bool is_tab_stop;
  ImGuiContext_conflict *g;
  ImGuiID id_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  bVar2 = false;
  if (id != 0) {
    bVar2 = id == (GImGui->LastItemData).ID;
  }
  if (bVar2) {
    bVar2 = ((GImGui->LastItemData).InFlags & 5U) == 0;
    if ((bVar2) &&
       ((window->DC).FocusCounterTabStop = (window->DC).FocusCounterTabStop + 1, pIVar1->NavId == id
       )) {
      pIVar1->NavIdTabCounter = (window->DC).FocusCounterTabStop;
    }
    if (((pIVar1->ActiveId == id) && ((pIVar1->TabFocusPressed & 1U) != 0)) &&
       (pIVar1->TabFocusRequestNextWindow == (ImGuiWindow *)0x0)) {
      pIVar1->TabFocusRequestNextWindow = window;
      if (((pIVar1->IO).KeyShift & 1U) == 0) {
        local_2c = 1;
      }
      else {
        local_2c = 0;
        if (bVar2) {
          local_2c = -1;
        }
      }
      pIVar1->TabFocusRequestNextCounterTabStop = (window->DC).FocusCounterTabStop + local_2c;
    }
    if (pIVar1->TabFocusRequestCurrWindow == window) {
      if ((bVar2) && ((window->DC).FocusCounterTabStop == pIVar1->TabFocusRequestCurrCounterTabStop)
         ) {
        pIVar1->NavJustTabbedId = id;
        (pIVar1->LastItemData).StatusFlags = (pIVar1->LastItemData).StatusFlags | 0x100;
      }
      else if (pIVar1->ActiveId == id) {
        ClearActiveID();
      }
    }
    return;
  }
  __assert_fail("id != 0 && id == g.LastItemData.ID",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0xd25,"void ImGui::ItemInputable(ImGuiWindow *, ImGuiID)");
}

Assistant:

void ImGui::ItemInputable(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0 && id == g.LastItemData.ID);

    // Increment counters
    // FIXME: ImGuiItemFlags_Disabled should disable more.
    const bool is_tab_stop = (g.LastItemData.InFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    if (is_tab_stop)
    {
        window->DC.FocusCounterTabStop++;
        if (g.NavId == id)
            g.NavIdTabCounter = window->DC.FocusCounterTabStop;
    }

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.TabFocusPressed && g.TabFocusRequestNextWindow == NULL)
    {
        g.TabFocusRequestNextWindow = window;
        g.TabFocusRequestNextCounterTabStop = window->DC.FocusCounterTabStop + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.TabFocusRequestCurrWindow == window)
    {
        if (is_tab_stop && window->DC.FocusCounterTabStop == g.TabFocusRequestCurrCounterTabStop)
        {
            g.NavJustTabbedId = id; // FIXME-NAV: aim to eventually set in NavUpdate() once we finish the refactor
            g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_FocusedByTabbing;
            return;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }
}